

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

char * __thiscall String::findLast(String *this,char c)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = this->data->str;
  pcVar2 = pcVar1 + this->data->len;
  do {
    pcVar2 = pcVar2 + -1;
    if (pcVar2 < pcVar1) {
      return (char *)0x0;
    }
  } while (*pcVar2 != c);
  return pcVar2;
}

Assistant:

const char* findLast(char c) const
  {
    for(const char * start = data->str, * p = data->str + data->len - 1; p >= start; --p)
      if(*p == c)
        return p;
    return 0;
  }